

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

Gia_Man_t *
Gia_ManAreaBalance(Gia_Man_t *p,int fSimpleAnd,int nNewNodesMax,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Vec_Int_t *vCiLevels;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pGVar3;
  
  if ((p->pManTime != (void *)0x0) && (p->vLevels == (Vec_Int_t *)0x0)) {
    Gia_ManLevelWithBoxes(p);
  }
  vCiLevels = Gia_ManGetCiLevels(p);
  pGVar2 = p;
  if (p->vMapping != (Vec_Int_t *)0x0) {
    pGVar2 = (Gia_Man_t *)Dsm_ManDeriveGia(p,0);
  }
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
  }
  if (fSimpleAnd == 0) {
    pGVar3 = Gia_ManDupMuxes(pGVar2,2);
  }
  else {
    pGVar3 = Gia_ManDup(pGVar2);
  }
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
  }
  if (pGVar2 != p) {
    Gia_ManStop(pGVar2);
  }
  pGVar2 = Dam_ManAreaBalanceInt(pGVar3,vCiLevels,nNewNodesMax,fVerbose,fVeryVerbose);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar3);
  if (vCiLevels != (Vec_Int_t *)0x0) {
    if (vCiLevels->pArray != (int *)0x0) {
      free(vCiLevels->pArray);
      vCiLevels->pArray = (int *)0x0;
    }
    free(vCiLevels);
  }
  pGVar3 = Gia_ManDupNoMuxes(pGVar2);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar2);
  iVar1 = Gia_ManIsNormalized(pGVar3);
  pGVar2 = pGVar3;
  if (iVar1 == 0) {
    pGVar2 = Gia_ManDupNormalize(pGVar3,0);
    Gia_ManStop(pGVar3);
  }
  Gia_ManTransferTiming(pGVar2,p);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManAreaBalance( Gia_Man_t * p, int fSimpleAnd, int nNewNodesMax, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew0, * pNew, * pNew1, * pNew2;
    Vec_Int_t * vCiLevels;
    // determine CI levels
    if ( p->pManTime && p->vLevels == NULL )
        Gia_ManLevelWithBoxes( p );
    vCiLevels = Gia_ManGetCiLevels( p );
    // get the starting manager
    pNew0 = Gia_ManHasMapping(p) ? (Gia_Man_t *)Dsm_ManDeriveGia(p, 0) : p;
    if ( fVerbose )     Gia_ManPrintStats( pNew0, NULL );
    // derive internal manager
    pNew = fSimpleAnd ? Gia_ManDup( pNew0 ) : Gia_ManDupMuxes( pNew0, 2 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    if ( pNew0 != p ) Gia_ManStop( pNew0 );
    // perform the operation
    pNew1 = Dam_ManAreaBalanceInt( pNew, vCiLevels, nNewNodesMax, fVerbose, fVeryVerbose );
    if ( fVerbose )     Gia_ManPrintStats( pNew1, NULL );
    Gia_ManStop( pNew );
    Vec_IntFreeP( &vCiLevels );
    // derive the final result
    pNew2 = Gia_ManDupNoMuxes( pNew1 );
    if ( fVerbose )     Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew1 );
    // normalize if needed
    if ( !Gia_ManIsNormalized(pNew2) )
    {
        pNew2 = Gia_ManDupNormalize( pNew1 = pNew2, 0 );
        Gia_ManStop( pNew1 );
    }
    Gia_ManTransferTiming( pNew2, p );
    return pNew2;
}